

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

double ClipperLib::Area(OutRec *outRec,bool UseFullInt64Range)

{
  double dVar1;
  double local_b0;
  double a_1;
  Int128 local_98;
  Int128 local_88;
  Int128 local_78;
  Int128 local_68;
  Int128 local_58;
  Int128 local_48;
  undefined1 local_38 [8];
  Int128 a;
  OutPt *op;
  bool UseFullInt64Range_local;
  OutRec *outRec_local;
  
  if (outRec->pts == (OutPt *)0x0) {
    outRec_local = (OutRec *)0x0;
  }
  else {
    a.lo = (long64)outRec->pts;
    if (UseFullInt64Range) {
      Int128::Int128((Int128 *)local_38,0);
      do {
        Int128::Int128(&local_68,*(long64 *)(*(long *)(a.lo + 0x20) + 8));
        Int128::Int128(&local_78,*(long64 *)(a.lo + 0x10));
        Int128::operator*(&local_58,&local_68);
        Int128::Int128(&local_98,*(long64 *)(a.lo + 8));
        Int128::Int128((Int128 *)&a_1,*(long64 *)(*(long *)(a.lo + 0x20) + 0x10));
        Int128::operator*(&local_88,&local_98);
        Int128::operator-(&local_48,&local_58);
        Int128::operator+=((Int128 *)local_38,&local_48);
        a.lo = *(long *)(a.lo + 0x18);
      } while ((OutPt *)a.lo != outRec->pts);
      dVar1 = Int128::AsDouble((Int128 *)local_38);
      outRec_local = (OutRec *)(dVar1 / 2.0);
    }
    else {
      local_b0 = 0.0;
      do {
        local_b0 = (double)(*(long *)(*(long *)(a.lo + 0x20) + 8) * *(long *)(a.lo + 0x10) -
                           *(long *)(a.lo + 8) * *(long *)(*(long *)(a.lo + 0x20) + 0x10)) +
                   local_b0;
        a.lo = *(long *)(a.lo + 0x18);
      } while ((OutPt *)a.lo != outRec->pts);
      outRec_local = (OutRec *)(local_b0 / 2.0);
    }
  }
  return (double)outRec_local;
}

Assistant:

double Area(const OutRec &outRec, bool UseFullInt64Range)
{
  if (!outRec.pts)
    return 0.0;

  OutPt *op = outRec.pts;
  if (UseFullInt64Range) {
    Int128 a(0);
    do {
      a += (Int128(op->prev->pt.X) * Int128(op->pt.Y)) -
        Int128(op->pt.X) * Int128(op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a.AsDouble() / 2;
  }
  else
  {
    double a = 0;
    do {
      a += (op->prev->pt.X * op->pt.Y) - (op->pt.X * op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a/2;
  }
}